

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::InputFile(InputFile *this,IStream *is,int numThreads)

{
  bool bVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined8 in_RSI;
  GenericInputFile *in_RDI;
  stringstream _iex_replace_s;
  int *in_stack_00000120;
  IStream *in_stack_00000128;
  GenericInputFile *in_stack_00000130;
  InputFile *in_stack_00000170;
  BaseExc *e;
  int *in_stack_000003d0;
  IStream *in_stack_000003d8;
  Header *in_stack_000003e0;
  undefined1 in_stack_0000188e;
  undefined1 in_stack_0000188f;
  Header *in_stack_00001890;
  InputStreamMutex *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdcc;
  Data *in_stack_fffffffffffffdd0;
  IStream *in_stack_fffffffffffffdd8;
  InputFile *in_stack_fffffffffffffde0;
  string *in_stack_ffffffffffffff48;
  Header *in_stack_ffffffffffffff50;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__InputFile_0350f488;
  pp_Var2 = (_func_int **)operator_new(0x108);
  Data::Data(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  in_RDI[1]._vptr_GenericInputFile = pp_Var2;
  in_RDI[1]._vptr_GenericInputFile[0x1f] = (_func_int *)0x0;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x20) = 0;
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000130,in_stack_00000128,in_stack_00000120);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  else {
    p_Var3 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffdc0);
    in_RDI[1]._vptr_GenericInputFile[0x1f] = p_Var3;
    *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x1f] + 0x28) = in_RSI;
    Header::readFrom(in_stack_000003e0,in_stack_000003d8,in_stack_000003d0);
    bVar1 = isNonImage(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    if (((!bVar1) && (bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc)), !bVar1)
        ) && (bVar1 = Header::hasType((Header *)0x867cbf), bVar1)) {
      isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
      Header::setType(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    Header::sanityCheck(in_stack_00001890,(bool)in_stack_0000188f,(bool)in_stack_0000188e);
    initialize(in_stack_00000170);
  }
  return;
}

Assistant:

InputFile::InputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _data (new Data (numThreads))
{
    _data->_streamData=NULL;
    _data->_deleteStream=false;
    try
    {
        readMagicNumberAndVersionField(is, _data->version);

        //
        // Backward compatibility to read multpart file.
        //
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(is);
        }
        else
        {
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = &is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            
            // fix type attribute in single part regular image types
            // (may be wrong if an old version of OpenEXR converts
            // a tiled image to scanline or vice versa)
            if(!isNonImage(_data->version)  && 
               !isMultiPart(_data->version) &&  
               _data->header.hasType())
            {
                _data->header.setType(isTiled(_data->version) ? TILEDIMAGE : SCANLINEIMAGE);
            }
            
            _data->header.sanityCheck (isTiled (_data->version));

            initialize();
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data && !_data->multiPartBackwardSupport && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;
        _data=NULL; 

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << is.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data &&  !_data->multiPartBackwardSupport  && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;
        _data=NULL;
        throw;
    }
}